

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtMoveVar(word *pF,int nVars,int *V2P,int *P2V,int v,int p)

{
  word *pwVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  word wVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  word *pwVar14;
  word *pwVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  word (*pawVar20) [3];
  long lVar21;
  word *pwVar22;
  word *pwVar23;
  
  iVar2 = V2P[v];
  if (iVar2 != p) {
    iVar19 = iVar2;
    if (iVar2 < p) {
      iVar19 = p;
    }
    iVar17 = iVar2;
    if (p < iVar2) {
      iVar17 = p;
    }
    if ((iVar19 <= iVar17) || (nVars <= iVar19)) {
      __assert_fail("iVar < jVar && jVar < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x692,"void Abc_TtSwapVars(word *, int, int, int)");
    }
    bVar9 = (byte)iVar17;
    bVar10 = (byte)iVar19;
    if (nVars < 7) {
      uVar12 = *pF;
      bVar9 = (char)(-1 << (bVar9 & 0x1f)) + (char)(1 << (bVar10 & 0x1f));
      *pF = (uVar12 & s_PPMasks[iVar17][iVar19][2]) >> (bVar9 & 0x3f) |
            (s_PPMasks[iVar17][iVar19][1] & uVar12) << (bVar9 & 0x3f) |
            s_PPMasks[iVar17][iVar19][0] & uVar12;
    }
    else if (iVar19 < 6) {
      bVar8 = (char)nVars - 6U & 0x1f;
      pawVar20 = s_PPMasks[iVar17] + iVar19;
      bVar9 = (char)(-1 << (bVar9 & 0x1f)) + (char)(1 << (bVar10 & 0x1f));
      uVar18 = 0;
      uVar12 = (ulong)(uint)(1 << bVar8);
      if (1 << bVar8 < 1) {
        uVar12 = uVar18;
      }
      for (; uVar12 != uVar18; uVar18 = uVar18 + 1) {
        uVar4 = pF[uVar18];
        pF[uVar18] = (uVar4 & (*pawVar20)[2]) >> (bVar9 & 0x3f) |
                     ((*pawVar20)[1] & uVar4) << (bVar9 & 0x3f) | (*pawVar20)[0] & uVar4;
      }
    }
    else {
      pwVar1 = pF + (1 << ((char)nVars - 6U & 0x1f));
      if (iVar17 < 6) {
        uVar11 = 1 << (bVar10 - 6 & 0x1f);
        iVar19 = 2 << (bVar10 - 6 & 0x1f);
        uVar12 = 0;
        if (0 < (int)uVar11) {
          uVar12 = (ulong)uVar11;
        }
        pwVar22 = pF + (int)uVar11;
        for (; pF < pwVar1; pF = pF + iVar19) {
          for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
            uVar4 = pF[uVar18];
            uVar5 = s_Truths6[iVar17];
            bVar10 = (byte)(1 << (bVar9 & 0x1f));
            uVar6 = pwVar22[uVar18];
            pF[uVar18] = (uVar6 << (bVar10 & 0x3f) ^ uVar4) & uVar5 ^ uVar4;
            pwVar22[uVar18] = uVar6 & uVar5 | (uVar5 & uVar4) >> (bVar10 & 0x3f);
          }
          pwVar22 = pwVar22 + iVar19;
        }
      }
      else {
        bVar8 = bVar9 - 6 & 0x1f;
        uVar11 = 1 << bVar8;
        iVar19 = 2 << (bVar10 - 6 & 0x1f);
        uVar12 = 0;
        if (0 < 1 << bVar8) {
          uVar12 = (ulong)uVar11;
        }
        lVar21 = (long)(2 << (bVar9 - 6 & 0x1f));
        lVar16 = (long)(1 << (bVar10 - 6 & 0x1f));
        pwVar22 = pF + lVar16;
        pwVar14 = pF + (int)uVar11;
        for (; pF < pwVar1; pF = pF + iVar19) {
          pwVar15 = pwVar14;
          pwVar23 = pwVar22;
          for (lVar13 = 0; lVar13 < lVar16; lVar13 = lVar13 + lVar21) {
            for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
              wVar7 = pwVar15[uVar18];
              pwVar15[uVar18] = pwVar23[uVar18];
              pwVar23[uVar18] = wVar7;
            }
            pwVar23 = pwVar23 + lVar21;
            pwVar15 = pwVar15 + lVar21;
          }
          pwVar22 = pwVar22 + iVar19;
          pwVar14 = pwVar14 + iVar19;
        }
      }
    }
    V2P[P2V[iVar2]] = p;
    V2P[P2V[p]] = iVar2;
    uVar11 = P2V[iVar2];
    uVar3 = P2V[p];
    P2V[iVar2] = uVar11 ^ uVar3;
    uVar11 = uVar11 ^ uVar3 ^ P2V[p];
    P2V[p] = uVar11;
    P2V[iVar2] = P2V[iVar2] ^ uVar11;
  }
  return;
}

Assistant:

static inline void Abc_TtMoveVar( word * pF, int nVars, int * V2P, int * P2V, int v, int p )
{
    int iVar = V2P[v], jVar = p;
    if ( iVar == jVar )
        return;
    Abc_TtSwapVars( pF, nVars, iVar, jVar );
    V2P[P2V[iVar]] = jVar;
    V2P[P2V[jVar]] = iVar;
    P2V[iVar] ^= P2V[jVar];
    P2V[jVar] ^= P2V[iVar];
    P2V[iVar] ^= P2V[jVar];
}